

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::CreateMakeVariable
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *s,string *s2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer ppVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  size_type sVar7;
  mapped_type *pmVar8;
  allocator<char> local_271;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  uint local_1d0;
  char local_1cc [4];
  int ni_1;
  char buffer_1 [12];
  string local_1a0 [32];
  undefined1 local_180 [8];
  string str2;
  string str1;
  int size;
  int keep;
  char local_114 [8];
  char buffer [12];
  int ni;
  undefined1 local_f0 [8];
  string ret;
  _Self local_b8;
  iterator i;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string unmodified;
  string *s2_local;
  string *s_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  unmodified.field_2._8_8_ = s2;
  cmAlphaNum::cmAlphaNum(&local_78,s);
  cmAlphaNum::cmAlphaNum(&local_a8,(string *)unmodified.field_2._8_8_);
  cmStrCat<>((string *)local_48,&local_78,&local_a8);
  if ((((this->MakefileVariableSize == 0) &&
       (lVar5 = std::__cxx11::string::find((char)local_48,0x2e), lVar5 == -1)) &&
      (this->MakefileVariableSize == 0)) &&
     (((lVar5 = std::__cxx11::string::find((char)local_48,0x2b), lVar5 == -1 &&
       (this->MakefileVariableSize == 0)) &&
      (lVar5 = std::__cxx11::string::find((char)local_48,0x2d), lVar5 == -1)))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    i._M_node._4_4_ = 1;
    goto LAB_006b1af2;
  }
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->MakeVariableMap,(key_type *)local_48);
  ret.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->MakeVariableMap);
  bVar1 = std::operator!=(&local_b8,(_Self *)((long)&ret.field_2 + 8));
  if (bVar1) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar6->second);
    i._M_node._4_4_ = 1;
    goto LAB_006b1af2;
  }
  std::__cxx11::string::string((string *)local_f0,(string *)local_48);
  if (this->MakefileVariableSize == 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    buffer[0xb] = '.';
    buffer[10] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,buffer + 0xb,buffer + 10);
    cmsys::SystemTools::ReplaceString((string *)local_f0,"-","__");
    cmsys::SystemTools::ReplaceString((string *)local_f0,"+","___");
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    while (sVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::count(&this->ShortMakeVariableMap,(key_type *)local_f0),
          sVar7 != 0 && (int)buffer._4_4_ < 1000) {
      buffer._4_4_ = buffer._4_4_ + 1;
      snprintf(local_114,0xc,"%04d",(ulong)(uint)buffer._4_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     local_114);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&size);
      std::__cxx11::string::~string((string *)&size);
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->ShortMakeVariableMap,(key_type *)local_f0);
    std::__cxx11::string::operator=((string *)pmVar8,"1");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->MakeVariableMap,(key_type *)local_48);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_f0);
    i._M_node._4_4_ = 1;
  }
  else {
    iVar2 = std::__cxx11::string::size();
    if (this->MakefileVariableSize < iVar2) {
      iVar2 = this->MakefileVariableSize;
      std::__cxx11::string::string((string *)(str2.field_2._M_local_buf + 8),(string *)s);
      std::__cxx11::string::string((string *)local_180,(string *)unmodified.field_2._8_8_);
      iVar3 = std::__cxx11::string::size();
      if (iVar2 + -8 < iVar3) {
        std::__cxx11::string::substr((ulong)local_1a0,(ulong)local_180);
        std::__cxx11::string::operator=((string *)local_180,local_1a0);
        std::__cxx11::string::~string(local_1a0);
      }
      iVar3 = std::__cxx11::string::size();
      iVar4 = std::__cxx11::string::size();
      if (iVar2 + -5 < iVar3 + iVar4) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)(buffer_1 + 4),(ulong)((long)&str2.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(str2.field_2._M_local_buf + 8),(string *)(buffer_1 + 4));
        std::__cxx11::string::~string((string *)(buffer_1 + 4));
      }
      local_1d0 = 0;
      snprintf(local_1cc,0xc,"%04d",0);
      std::operator+(&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&str2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180)
      ;
      std::operator+(&local_1f0,&local_210,local_1cc);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      while (sVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::count(&this->ShortMakeVariableMap,(key_type *)local_f0),
            sVar7 != 0 && (int)local_1d0 < 1000) {
        local_1d0 = local_1d0 + 1;
        snprintf(local_1cc,0xc,"%04d",(ulong)local_1d0);
        std::operator+(&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&str2.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180);
        std::operator+(&local_230,&local_250,local_1cc);
        std::__cxx11::string::operator=((string *)local_f0,(string *)&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
      }
      bVar1 = local_1d0 != 1000;
      if (bVar1) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->ShortMakeVariableMap,(key_type *)local_f0);
        std::__cxx11::string::operator=((string *)pmVar8,"1");
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"Borland makefile variable length too long",&local_271);
        cmSystemTools::Error(&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      }
      i._M_node._5_3_ = 0;
      i._M_node._4_1_ = !bVar1;
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)(str2.field_2._M_local_buf + 8));
      if (i._M_node._4_4_ != 0) goto LAB_006b1ad6;
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->MakeVariableMap,(key_type *)local_48);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_f0);
    i._M_node._4_4_ = 1;
  }
LAB_006b1ad6:
  std::__cxx11::string::~string((string *)local_f0);
LAB_006b1af2:
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::CreateMakeVariable(
  std::string const& s, std::string const& s2)
{
  std::string unmodified = cmStrCat(s, s2);
  // if there is no restriction on the length of make variables
  // and there are no "." characters in the string, then return the
  // unmodified combination.
  if ((!this->MakefileVariableSize &&
       unmodified.find('.') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('+') == std::string::npos) &&
      (!this->MakefileVariableSize &&
       unmodified.find('-') == std::string::npos)) {
    return unmodified;
  }

  // see if the variable has been defined before and return
  // the modified version of the variable
  auto i = this->MakeVariableMap.find(unmodified);
  if (i != this->MakeVariableMap.end()) {
    return i->second;
  }
  // start with the unmodified variable
  std::string ret = unmodified;
  // if this there is no value for this->MakefileVariableSize then
  // the string must have bad characters in it
  if (!this->MakefileVariableSize) {
    std::replace(ret.begin(), ret.end(), '.', '_');
    cmSystemTools::ReplaceString(ret, "-", "__");
    cmSystemTools::ReplaceString(ret, "+", "___");
    int ni = 0;
    char buffer[12];
    // make sure the _ version is not already used, if
    // it is used then add number to the end of the variable
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      snprintf(buffer, sizeof(buffer), "%04d", ni);
      ret = unmodified + buffer;
    }
    this->ShortMakeVariableMap[ret] = "1";
    this->MakeVariableMap[unmodified] = ret;
    return ret;
  }

  // if the string is greater than 32 chars it is an invalid variable name
  // for borland make
  if (static_cast<int>(ret.size()) > this->MakefileVariableSize) {
    int keep = this->MakefileVariableSize - 8;
    int size = keep + 3;
    std::string str1 = s;
    std::string str2 = s2;
    // we must shorten the combined string by 4 characters
    // keep no more than 24 characters from the second string
    if (static_cast<int>(str2.size()) > keep) {
      str2 = str2.substr(0, keep);
    }
    if (static_cast<int>(str1.size()) + static_cast<int>(str2.size()) > size) {
      str1 = str1.substr(0, size - str2.size());
    }
    char buffer[12];
    int ni = 0;
    snprintf(buffer, sizeof(buffer), "%04d", ni);
    ret = str1 + str2 + buffer;
    while (this->ShortMakeVariableMap.count(ret) && ni < 1000) {
      ++ni;
      snprintf(buffer, sizeof(buffer), "%04d", ni);
      ret = str1 + str2 + buffer;
    }
    if (ni == 1000) {
      cmSystemTools::Error("Borland makefile variable length too long");
      return unmodified;
    }
    // once an unused variable is found
    this->ShortMakeVariableMap[ret] = "1";
  }
  // always make an entry into the unmodified to variable map
  this->MakeVariableMap[unmodified] = ret;
  return ret;
}